

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall
LineSplitter_SingleString_Test::LineSplitter_SingleString_Test(LineSplitter_SingleString_Test *this)

{
  LineSplitter_SingleString_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__LineSplitter_SingleString_Test_002ebfa0;
  return;
}

Assistant:

TEST (LineSplitter, SingleString) {
    using namespace pstore::dump;

    array::container container;
    auto const str = "hello\n"s;

    line_splitter ls (&container);
    ls.append (pstore::gsl::make_span (str));

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello");
}